

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void kj::ArrayDisposer::Dispose_<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::destruct
               (void *ptr)

{
  void *ptr_local;
  
  dtor<kj::Array<capnp::Orphan<capnp::compiler::Token>>>
            ((Array<capnp::Orphan<capnp::compiler::Token>_> *)ptr);
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }